

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

bool Search::search_predictNeedsExample(search_private *priv)

{
  int iVar1;
  long in_RDI;
  int pol;
  bool in_stack_000001c7;
  search_private *in_stack_000001c8;
  
  switch(*(undefined4 *)(in_RDI + 0x6c)) {
  case 0:
    return false;
  case 1:
    return true;
  case 2:
    if (*(int *)(in_RDI + 0x298) == 4) {
      return true;
    }
    break;
  case 3:
    if ((ulong)(*(long *)(in_RDI + 0x98) + *(long *)(in_RDI + 0x660)) < *(ulong *)(in_RDI + 0x230))
    {
      return false;
    }
    if (*(long *)(in_RDI + 0x98) + *(long *)(in_RDI + 0x660) == *(long *)(in_RDI + 0x230)) {
      return true;
    }
    if ((*(long *)(in_RDI + 0x80) != 0) && (*(ulong *)(in_RDI + 0x80) <= *(ulong *)(in_RDI + 0x208))
       ) {
      return false;
    }
    break;
  case 4:
    return false;
  }
  iVar1 = choose_policy(in_stack_000001c8,in_stack_000001c7);
  return iVar1 != -1;
}

Assistant:

bool search_predictNeedsExample(search_private& priv)
{
  // this is basically copied from the logic of search_predict()
  switch (priv.state)
  {
    case INITIALIZE:
      return false;
    case GET_TRUTH_STRING:
      return false;
    case INIT_TEST:
      return true;
    case INIT_TRAIN:
      // TODO: do we need to do something here for metatasks?
      // if (priv.beam && (priv.t < priv.beam_actions.size()))
      //  return false;
      if (priv.rollout_method == NO_ROLLOUT)
        return true;
      break;
    case LEARN:
      if (priv.t + priv.meta_t < priv.learn_t)
        return false;  // TODO: in meta search mode with foreach feature we'll need it even here
      if (priv.t + priv.meta_t == priv.learn_t)
        return true;  // SPEEDUP: we really only need it on the last learn_a, but this is hard to know...
      // t > priv.learn_t
      if ((priv.rollout_num_steps > 0) && (priv.loss_declared_cnt >= priv.rollout_num_steps))
        return false;  // skipping
      break;
  }

  int pol = choose_policy(priv, false);  // choose a policy but don't advance prng
  return (pol != -1);
}